

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O1

int av1_rc_pick_q_and_bounds
              (AV1_COMP *cpi,int width,int height,int gf_index,int *bottom_index,int *top_index)

{
  PRIMARY_RATE_CONTROL *pPVar1;
  byte bVar2;
  FRAME_UPDATE_TYPE FVar3;
  FRAME_TYPE frame_type;
  aom_rc_mode aVar4;
  aom_superres_mode superres_mode;
  aom_bit_depth_t aVar5;
  uint uVar6;
  YV12_BUFFER_CONFIG *pYVar7;
  AV1_PRIMARY *pAVar8;
  SequenceHeader *pSVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  undefined *puVar14;
  long lVar15;
  YV12_BUFFER_CONFIG *pYVar16;
  ulong uVar17;
  long lVar18;
  int iVar19;
  RefCntBuffer *pRVar20;
  ulong uVar21;
  uint uVar22;
  uint *puVar23;
  uint8_t *puVar24;
  int qindex;
  uint uVar25;
  int iVar26;
  long lVar27;
  int j;
  AV1_PRIMARY *pAVar28;
  long lVar29;
  long lVar30;
  double dVar31;
  double dVar32;
  uint sse;
  int active_best_quality;
  uint local_10b4;
  int local_10b0;
  int local_10ac;
  uint *local_10a8;
  long local_10a0;
  RATE_CONTROL *local_1098;
  AV1_PRIMARY *local_1090;
  AV1_PRIMARY *local_1088;
  uint *local_1080;
  PRIMARY_RATE_CONTROL *local_1078;
  uint local_1070;
  int local_106c;
  uint8_t *local_1068;
  uint local_1060;
  uint local_105c;
  long local_1058;
  long local_1050;
  ulong local_1048;
  long local_1040;
  uint local_1038 [1026];
  
  pAVar28 = cpi->ppi;
  aVar4 = (cpi->oxcf).rc_cfg.mode;
  local_10a0 = (long)gf_index;
  local_10b0 = width;
  local_10ac = height;
  local_10a8 = (uint *)top_index;
  local_1088 = pAVar28;
  local_1080 = (uint *)bottom_index;
  if ((((aVar4 == AOM_Q) && ((pAVar28->gf_group).update_type[local_10a0] != '\x03')) ||
      ((cpi->oxcf).pass != AOM_RC_ONE_PASS)) || (pAVar28->lap_enabled != 0)) {
    local_1068 = (uint8_t *)CONCAT44(local_1068._4_4_,gf_index);
    local_1098 = &cpi->rc;
    local_1078 = &pAVar28->p_rc;
    bVar2 = (cpi->common).current_frame.frame_type;
    local_1090 = (AV1_PRIMARY *)CONCAT71(local_1090._1_7_,bVar2);
    superres_mode = cpi->superres_mode;
    uVar22 = (uint)(cpi->common).superres_scale_denominator;
    uVar25 = (uint)((bVar2 & 0xfd) == 0);
    iVar11 = get_active_cq_level(local_1098,local_1078,&cpi->oxcf,uVar25,superres_mode,uVar22);
    pAVar28 = local_1088;
    lVar15 = local_10a0;
    if (aVar4 == AOM_Q) {
      iVar11 = get_active_cq_level(local_1098,local_1078,&cpi->oxcf,uVar25,superres_mode,uVar22);
      local_1038[0] = 0;
      local_10b4 = (cpi->rc).active_worst_quality;
      if (((ulong)local_1090 & 0xfd) == 0) {
        get_intra_q_and_bounds
                  (cpi,local_10b0,local_10ac,(int *)local_1038,(int *)&local_10b4,iVar11);
      }
      else {
        local_1038[0] = get_active_best_quality(cpi,local_10b4,iVar11,(int)local_1068);
      }
      uVar25 = local_1038[0];
      if ((0 < iVar11) && (uVar25 = 1, 1 < (int)local_1038[0])) {
        uVar25 = local_1038[0];
      }
      local_1038[0] = uVar25;
      *local_10a8 = local_10b4;
      *local_1080 = local_1038[0];
      uVar25 = (cpi->rc).best_quality;
      if ((int)uVar25 < (int)*local_10a8) {
        uVar25 = *local_10a8;
      }
      *local_10a8 = uVar25;
      uVar22 = (cpi->rc).worst_quality;
      if ((int)uVar22 <= (int)uVar25) {
        uVar25 = uVar22;
      }
      *local_10a8 = uVar25;
      uVar25 = (cpi->rc).best_quality;
      if ((int)uVar25 < (int)*local_1080) {
        uVar25 = *local_1080;
      }
      *local_1080 = uVar25;
      uVar22 = (cpi->rc).worst_quality;
      if ((int)uVar22 <= (int)uVar25) {
        uVar25 = uVar22;
      }
      *local_1080 = uVar25;
      uVar25 = (cpi->rc).best_quality;
      if ((int)uVar25 < (int)local_1038[0]) {
        uVar25 = local_1038[0];
      }
      uVar22 = (cpi->rc).worst_quality;
      lVar15 = local_10a0;
      pAVar28 = local_1088;
      if ((int)uVar22 <= (int)uVar25) {
        uVar25 = uVar22;
      }
      goto LAB_00201881;
    }
    local_1038[0] = 0;
    uVar25 = (cpi->rc).active_worst_quality;
    local_10b4 = uVar25;
    if (((ulong)local_1090 & 0xfd) == 0) {
      get_intra_q_and_bounds(cpi,local_10b0,local_10ac,(int *)local_1038,(int *)&local_10b4,iVar11);
      lVar15 = local_10a0;
      pAVar28 = local_1088;
    }
    else {
      FVar3 = (local_1088->gf_group).update_type[local_10a0];
      iVar19 = (local_1088->gf_group).layer_depth[local_10a0];
      if (iVar19 - 7U < 0xfffffffb) {
        local_1038[0] = get_active_best_quality(cpi,uVar25,iVar11,(int)local_1068);
      }
      else {
        local_1038[0] = (local_1088->p_rc).active_best_quality[iVar19 - 1] + 1;
        if ((int)uVar25 <= (int)local_1038[0]) {
          local_1038[0] = uVar25;
        }
        local_1038[0] = (int)(uVar25 - local_1038[0]) / 2 + local_1038[0];
      }
      if (((cpi->rc).is_src_frame_alt_ref == 0) &&
         ((((cpi->refresh_frame).golden_frame != false ||
           ((cpi->refresh_frame).alt_ref_frame != false)) || (FVar3 == '\x06')))) {
        iVar19 = local_1038[0] + uVar25 * 3 + 2;
        iVar11 = local_1038[0] + uVar25 * 3 + 5;
        if (-1 < iVar19) {
          iVar11 = iVar19;
        }
        local_10b4 = iVar11 >> 2;
      }
    }
    pAVar8 = cpi->ppi;
    uVar25 = local_1038[0];
    uVar22 = local_10b4;
    if ((cpi->oxcf).rc_cfg.mode != AOM_Q) {
      iVar11 = (pAVar8->twopass).extend_minq;
      iVar19 = (pAVar8->twopass).extend_maxq;
      iVar26 = iVar11 + 7;
      if (-1 < iVar11) {
        iVar26 = iVar11;
      }
      uVar25 = local_1038[0] - (iVar26 >> 3);
      iVar11 = iVar19 + 3;
      if (-1 < iVar19) {
        iVar11 = iVar19;
      }
      uVar22 = local_10b4 + (iVar11 >> 2);
    }
    if (((((cpi->common).current_frame.frame_type & 0xfd) != 0) ||
        ((pAVar8->p_rc).this_key_frame_forced == 0)) ||
       ((pAVar8->twopass).last_kfgroup_zeromotion_pct < 0x5f)) {
      bVar2 = cpi->gf_frame_index;
      if ((0x32UL >> ((ulong)(pAVar8->gf_group).update_type[bVar2] & 0x3f) & 1) == 0) {
        iVar11 = (pAVar8->gf_group).layer_depth[bVar2];
        iVar19 = 6;
        if (iVar11 < 6) {
          iVar19 = iVar11;
        }
        dVar31 = arf_layer_deltas[iVar19];
      }
      else {
        dVar31 = 1.0;
      }
      iVar11 = av1_compute_qdelta_by_rate(cpi,(pAVar8->gf_group).frame_type[bVar2],uVar22,dVar31);
      uVar22 = iVar11 + uVar22;
      if ((int)uVar22 <= (int)uVar25) {
        uVar22 = uVar25;
      }
    }
    iVar11 = (cpi->common).superres_upscaled_width;
    uVar12 = uVar25;
    if (((((cpi->common).width != iVar11) || (iVar11 != (cpi->common).render_width)) ||
        ((cpi->common).superres_upscaled_height != (cpi->common).render_height)) &&
       ((bVar2 = (cpi->common).current_frame.frame_type, (bVar2 & 0xfd) != 0 &&
        (((cpi->ppi->gf_group).update_type[cpi->gf_frame_index] & 0xfe) != 2)))) {
      iVar11 = av1_compute_qdelta_by_rate(cpi,bVar2,uVar25,2.0);
      uVar13 = (cpi->rc).best_quality;
      uVar12 = iVar11 + uVar25;
      if ((int)(iVar11 + uVar25) <= (int)uVar13) {
        uVar12 = uVar13;
      }
    }
    uVar13 = (cpi->rc).worst_quality;
    uVar6 = uVar13;
    if ((int)uVar12 < (int)uVar13) {
      uVar6 = uVar12;
    }
    uVar25 = (cpi->rc).best_quality;
    if ((int)uVar12 < (int)uVar25) {
      uVar6 = uVar25;
    }
    if ((int)uVar22 < (int)uVar13) {
      uVar13 = uVar22;
    }
    if ((int)uVar22 < (int)uVar6) {
      uVar13 = uVar6;
    }
    uVar25 = uVar6;
    local_10b4 = uVar13;
    if ((cpi->oxcf).rc_cfg.mode != AOM_Q) {
      if (((cpi->common).current_frame.frame_type & 0xfd) == 0) {
        pAVar8 = cpi->ppi;
        if ((pAVar8->p_rc).this_key_frame_forced == 0) {
          if (((pAVar8->twopass).kf_zeromotion_pct < 99) || ((cpi->rc).frames_to_key < 2))
          goto LAB_0020178c;
        }
        else {
          uVar22 = (pAVar8->p_rc).last_boosted_qindex;
          if ((pAVar8->twopass).last_kfgroup_zeromotion_pct < 0x5f) {
            uVar25 = (int)(uVar13 + uVar6) / 2;
            if ((int)uVar25 <= (int)uVar22) {
              uVar22 = uVar25;
            }
          }
          else {
            uVar25 = (pAVar8->p_rc).last_kf_qindex;
            if ((int)uVar25 < (int)uVar22) {
              uVar22 = uVar25;
            }
          }
          uVar25 = uVar13;
          if ((int)uVar22 < (int)uVar13) {
            uVar25 = uVar22;
          }
          if ((int)uVar22 < (int)uVar6) {
            uVar25 = uVar6;
          }
        }
      }
      else {
LAB_0020178c:
        local_1038[0] = uVar6;
        uVar25 = av1_rc_regulate_q(cpi,(cpi->rc).this_frame_target,uVar6,uVar13,local_10b0,
                                   local_10ac);
        if (((int)uVar13 < (int)uVar25) &&
           ((cpi->rc).this_frame_target < (cpi->rc).max_frame_bandwidth)) {
          uVar25 = uVar13;
        }
        if ((int)uVar25 <= (int)uVar6) {
          uVar25 = uVar6;
        }
      }
    }
    if (((cpi->rc).max_frame_bandwidth <= (cpi->rc).this_frame_target) &&
       ((int)uVar13 < (int)uVar25)) {
      local_10b4 = uVar25;
    }
    *local_10a8 = local_10b4;
    *local_1080 = uVar6;
    goto LAB_00201881;
  }
  if (aVar4 == AOM_CBR) {
    cpi->rec_sse = 0xffffffffffffffff;
    if ((((cpi->sf).hl_sf.accurate_bit_estimate != 0) &&
        ((cpi->common).current_frame.frame_type != '\0')) &&
       (pYVar7 = cpi->unscaled_source, pYVar7 != (YV12_BUFFER_CONFIG *)0x0)) {
      lVar15 = (long)(cpi->common).remapped_ref_idx[0];
      if (lVar15 == -1) {
        pRVar20 = (RefCntBuffer *)0x0;
      }
      else {
        pRVar20 = (cpi->common).ref_frame_map[lVar15];
      }
      pYVar16 = &pRVar20->buf;
      if (pRVar20 == (RefCntBuffer *)0x0) {
        pYVar16 = (YV12_BUFFER_CONFIG *)0x0;
      }
      if (cpi->scaled_ref_buf[0] == (RefCntBuffer *)0x0) {
        local_1078 = (PRIMARY_RATE_CONTROL *)(pYVar7->field_5).field_0.y_buffer;
        iVar11 = (pYVar7->field_4).field_0.y_stride;
        puVar24 = (pYVar16->field_5).field_0.y_buffer;
        local_106c = (pYVar16->field_4).field_0.y_stride;
        lVar15 = 0;
        do {
          if ((*(int *)((long)pYVar7->store_buf_adr + lVar15 * 4 + -0x48) !=
               *(int *)((long)pYVar16->store_buf_adr + lVar15 * 4 + -0x48)) ||
             (*(int *)((long)pYVar7->store_buf_adr + lVar15 * 4 + -0x40) !=
              *(int *)((long)pYVar16->store_buf_adr + lVar15 * 4 + -0x40))) goto LAB_00201bad;
          lVar15 = lVar15 + 1;
        } while (lVar15 == 1);
        pSVar9 = (cpi->common).seq_params;
        iVar19 = pSVar9->mib_size >> (pSVar9->sb_size == BLOCK_128X128);
        uVar10 = (long)((cpi->common).mi_params.mi_cols + iVar19 + -1) / (long)iVar19;
        uVar17 = uVar10 & 0xffffffff;
        local_1070 = ((cpi->common).mi_params.mi_rows + iVar19 + -1) / iVar19;
        cpi->rec_sse = 0;
        uVar21 = 0;
        if ((int)local_1070 < 1) {
          lVar15 = 0;
        }
        else {
          local_1060 = (uint)uVar10;
          local_1050 = (long)(int)((iVar11 - local_1060) * 0x40);
          local_1058 = (long)(int)((local_106c - local_1060) * 0x40);
          lVar15 = 0;
          do {
            local_1048 = uVar21;
            if (0 < (int)uVar17) {
              uVar25 = 0;
              do {
                puVar23 = local_1038;
                local_1068 = puVar24;
                local_105c = uVar25;
                local_1040 = lVar15;
                memset(puVar23,0,0x1000);
                lVar15 = 0;
                lVar27 = 0;
                do {
                  pPVar1 = local_1078;
                  lVar29 = 0;
                  lVar30 = 0;
                  local_1098 = (RATE_CONTROL *)lVar15;
                  local_1090 = (AV1_PRIMARY *)puVar23;
                  do {
                    uVar25 = aom_avg_4x4_sse2((uint8_t *)((long)pPVar1 + lVar29 + lVar15 * iVar11),
                                              iVar11);
                    puVar24 = local_1068;
                    lVar18 = 0;
                    do {
                      *(uint *)((long)puVar23 + lVar18) = (uVar25 & 0xff) * 0x1010101;
                      lVar18 = lVar18 + 0x40;
                    } while (lVar18 != 0x100);
                    lVar29 = lVar29 + 4;
                    lVar30 = lVar30 + 1;
                    puVar23 = puVar23 + 1;
                  } while (lVar30 != 0x10);
                  lVar15 = (long)local_1098 + 4;
                  lVar27 = lVar27 + 1;
                  puVar23 = (uint *)((long)local_1090 + 0x100);
                } while (lVar27 != 0x10);
                (*cpi->ppi->fn_ptr[0xc].vf)
                          ((uint8_t *)local_1038,0x40,local_1068,local_106c,&local_10b4);
                lVar15 = local_1040 + (ulong)local_10b4;
                local_1078 = (PRIMARY_RATE_CONTROL *)((long)local_1078 + 0x40);
                puVar24 = puVar24 + 0x40;
                uVar25 = local_105c + 1;
                uVar17 = (ulong)local_1060;
              } while (uVar25 != local_1060);
            }
            puVar24 = puVar24 + local_1058;
            local_1078 = (PRIMARY_RATE_CONTROL *)((long)local_1078 + local_1050);
            uVar25 = (int)local_1048 + 1;
            uVar21 = (ulong)uVar25;
          } while (uVar25 != local_1070);
          iVar11 = 0;
          if (0 < (int)uVar17) {
            iVar11 = (int)uVar17;
          }
          uVar21 = (ulong)(0 < (int)(local_1070 * iVar11));
        }
        if ((char)uVar21 != '\0') {
          cpi->rec_sse = lVar15 + (ulong)(lVar15 == 0);
        }
      }
    }
LAB_00201bad:
    pAVar28 = local_1088;
    pAVar8 = cpi->ppi;
    uVar25 = calc_active_worst_quality_no_stats_cbr(cpi);
    lVar15 = local_10a0;
    aVar5 = ((cpi->common).seq_params)->bit_depth;
    if (aVar5 - AOM_BITS_8 < 5) {
      puVar14 = (&PTR_rtc_minq_8_005ce9a0)[aVar5 - AOM_BITS_8];
    }
    else {
      puVar14 = (undefined *)0x0;
    }
    local_1090 = pAVar8;
    if (((cpi->common).current_frame.frame_type & 0xfd) == 0) {
      if ((pAVar8->p_rc).this_key_frame_forced == 0) {
        if ((cpi->common).current_frame.frame_number == 0) {
          uVar22 = (cpi->rc).best_quality;
        }
        else {
          iVar11 = get_kf_active_quality(&pAVar8->p_rc,(pAVar8->p_rc).avg_frame_qindex[0],aVar5);
          iVar19 = local_10ac * local_10b0;
          dVar31 = av1_convert_qindex_to_q(iVar11,aVar5);
          iVar19 = av1_compute_qdelta(&cpi->rc,dVar31,
                                      *(double *)(&DAT_004feff0 + (ulong)(iVar19 < 0x18c01) * 8) *
                                      dVar31,aVar5);
          lVar15 = local_10a0;
          pAVar28 = local_1088;
          uVar22 = iVar19 + iVar11;
        }
      }
      else {
        iVar11 = (pAVar8->p_rc).last_boosted_qindex;
        dVar31 = av1_convert_qindex_to_q(iVar11,aVar5);
        iVar19 = av1_compute_qdelta(&cpi->rc,dVar31,dVar31 * 0.75,aVar5);
        uVar22 = iVar19 + iVar11;
        uVar12 = (cpi->rc).best_quality;
        lVar15 = local_10a0;
        if ((int)uVar22 <= (int)uVar12) {
          uVar22 = uVar12;
        }
      }
    }
    else if ((((cpi->rc).is_src_frame_alt_ref == 0) && (pAVar8->use_svc == 0)) &&
            (((cpi->oxcf).rc_cfg.gf_cbr_boost_pct != 0 &&
             (((cpi->refresh_frame).golden_frame != false ||
              ((cpi->refresh_frame).alt_ref_frame == true)))))) {
      uVar22 = uVar25;
      if ((1 < (cpi->rc).frames_since_key) &&
         (uVar22 = (pAVar8->p_rc).avg_frame_qindex[1], (int)uVar25 <= (int)uVar22)) {
        uVar22 = uVar25;
      }
      uVar22 = get_gf_active_quality(&pAVar8->p_rc,uVar22,aVar5);
    }
    else {
      uVar22 = (pAVar8->p_rc).avg_frame_qindex[1 < (cpi->common).current_frame.frame_number];
      if ((int)uVar25 <= (int)uVar22) {
        uVar22 = uVar25;
      }
      uVar22 = *(uint *)(puVar14 + (long)(int)uVar22 * 4);
    }
    puVar23 = local_10a8;
    uVar12 = (cpi->rc).worst_quality;
    uVar13 = uVar12;
    if ((int)uVar22 < (int)uVar12) {
      uVar13 = uVar22;
    }
    uVar6 = (cpi->rc).best_quality;
    if ((int)uVar22 < (int)uVar6) {
      uVar13 = uVar6;
    }
    if ((int)uVar25 < (int)uVar12) {
      uVar12 = uVar25;
    }
    if ((int)uVar25 < (int)uVar13) {
      uVar12 = uVar13;
    }
    *local_10a8 = uVar12;
    *local_1080 = uVar13;
    if ((((cpi->common).current_frame.frame_type == '\0') &&
        ((local_1090->p_rc).this_key_frame_forced == 0)) &&
       ((cpi->common).current_frame.frame_number != 0)) {
      iVar11 = av1_compute_qdelta_by_rate(cpi,'\0',uVar12,2.0);
      uVar25 = iVar11 + uVar12;
      *puVar23 = uVar25;
      if ((int)uVar25 <= (int)*local_1080) {
        uVar25 = *local_1080;
      }
      *puVar23 = uVar25;
    }
    uVar22 = av1_rc_regulate_q(cpi,(cpi->rc).this_frame_target,uVar13,uVar12,local_10b0,local_10ac);
    uVar25 = uVar22;
    if (((int)*puVar23 < (int)uVar22) &&
       (uVar25 = *puVar23, (cpi->rc).max_frame_bandwidth <= (cpi->rc).this_frame_target)) {
      *puVar23 = uVar22;
      uVar25 = uVar22;
    }
    (cpi->rc).active_worst_quality = *puVar23;
    goto LAB_00201881;
  }
  local_1090 = (AV1_PRIMARY *)CONCAT44(local_1090._4_4_,aVar4);
  local_1098 = &cpi->rc;
  pPVar1 = &pAVar28->p_rc;
  bVar2 = (cpi->common).current_frame.frame_type;
  uVar12 = get_active_cq_level(local_1098,pPVar1,&cpi->oxcf,(uint)((bVar2 & 0xfd) == 0),
                               cpi->superres_mode,(uint)(cpi->common).superres_scale_denominator);
  aVar5 = ((cpi->common).seq_params)->bit_depth;
  uVar25 = (cpi->common).current_frame.frame_number;
  uVar22 = (pAVar28->p_rc).last_q[0];
  if (bVar2 == 0) {
    if (uVar25 == 0) {
      uVar13 = (cpi->rc).worst_quality;
    }
    else {
      uVar13 = uVar22 * 2;
    }
  }
  else {
    uVar13 = (pAVar28->p_rc).last_q[1];
    if (((cpi->rc).is_src_frame_alt_ref == 0) &&
       ((((cpi->refresh_frame).golden_frame != false ||
         ((cpi->refresh_frame).bwd_ref_frame != false)) ||
        ((cpi->refresh_frame).alt_ref_frame == true)))) {
      if (uVar25 == 1) {
        iVar11 = uVar22 * 5 + 3;
        if (-1 < (int)(uVar22 * 5)) {
          iVar11 = uVar22 * 5;
        }
        uVar13 = iVar11 >> 2;
      }
    }
    else {
      if (uVar25 == 1) {
        uVar13 = uVar22;
      }
      uVar13 = uVar13 * 2;
    }
  }
  uVar22 = (cpi->rc).worst_quality;
  if ((int)uVar13 < (int)uVar22) {
    uVar22 = uVar13;
  }
  if (aVar5 - AOM_BITS_8 < 5) {
    puVar14 = (&PTR_inter_minq_8_005cea68)[aVar5 - AOM_BITS_8];
  }
  else {
    puVar14 = (undefined *)0x0;
  }
  if ((bVar2 & 0xfd) == 0) {
    if ((int)local_1090 == 3) {
      dVar32 = av1_convert_qindex_to_q(uVar12,aVar5);
      dVar31 = 0.25;
LAB_0020197c:
      iVar11 = av1_compute_qdelta(local_1098,dVar32,dVar31 * dVar32,aVar5);
      uVar13 = iVar11 + uVar12;
    }
    else {
      if ((pAVar28->p_rc).this_key_frame_forced == 0) {
        iVar11 = get_kf_active_quality(pPVar1,(pAVar28->p_rc).avg_frame_qindex[0],aVar5);
        iVar19 = local_10ac * local_10b0;
        dVar31 = av1_convert_qindex_to_q(iVar11,aVar5);
        iVar19 = av1_compute_qdelta(local_1098,dVar31,
                                    *(double *)(&DAT_004feff0 + (ulong)(iVar19 < 0x18c01) * 8) *
                                    dVar31,aVar5);
        uVar13 = iVar19 + iVar11;
        puVar23 = local_10a8;
        goto LAB_00201a80;
      }
      iVar11 = (pAVar28->p_rc).last_boosted_qindex;
      dVar31 = av1_convert_qindex_to_q(iVar11,aVar5);
      iVar19 = av1_compute_qdelta(local_1098,dVar31,dVar31 * 0.75,aVar5);
      uVar13 = iVar19 + iVar11;
    }
    uVar25 = (cpi->rc).best_quality;
    puVar23 = local_10a8;
    if ((int)uVar13 <= (int)uVar25) {
      uVar13 = uVar25;
    }
  }
  else if (((cpi->rc).is_src_frame_alt_ref == 0) &&
          (((cpi->refresh_frame).golden_frame != false ||
           ((cpi->refresh_frame).alt_ref_frame == true)))) {
    if (((cpi->rc).frames_since_key < 2) ||
       (uVar25 = (pAVar28->p_rc).avg_frame_qindex[1], (int)uVar22 <= (int)uVar25)) {
      uVar25 = (pAVar28->p_rc).avg_frame_qindex[0];
    }
    if ((int)local_1090 == 3) {
      dVar31 = av1_convert_qindex_to_q(uVar12,aVar5);
      puVar23 = local_10a8;
      if ((cpi->refresh_frame).alt_ref_frame == false) {
        dVar32 = 0.5;
      }
      else {
        dVar32 = 0.4;
      }
      iVar11 = av1_compute_qdelta(local_1098,dVar31,dVar32 * dVar31,aVar5);
      uVar25 = (cpi->rc).best_quality;
      uVar13 = iVar11 + uVar12;
      if ((int)(iVar11 + uVar12) <= (int)uVar25) {
        uVar13 = uVar25;
      }
    }
    else if ((int)local_1090 == 2) {
      if ((int)uVar12 < (int)uVar25) {
        uVar12 = uVar25;
      }
      iVar19 = get_gf_active_quality(pPVar1,uVar12,aVar5);
      iVar11 = iVar19 * 0xf + 0xf;
      if (-1 < iVar19 * 0xf) {
        iVar11 = iVar19 * 0xf;
      }
      uVar13 = iVar11 >> 4;
      puVar23 = local_10a8;
    }
    else {
      uVar13 = get_gf_active_quality(pPVar1,uVar25,aVar5);
      puVar23 = local_10a8;
    }
  }
  else {
    if ((int)local_1090 == 3) {
      dVar32 = av1_convert_qindex_to_q(uVar12,aVar5);
      dVar31 = *(double *)
                (&DAT_004ff090 + (ulong)((cpi->common).current_frame.frame_number & 0xf) * 8);
      goto LAB_0020197c;
    }
    uVar25 = *(uint *)(puVar14 + (long)(pAVar28->p_rc).avg_frame_qindex[1 < uVar25] * 4);
    if ((int)uVar12 < (int)uVar25) {
      uVar12 = uVar25;
    }
    puVar23 = local_10a8;
    uVar13 = uVar12;
    if ((int)local_1090 != 2) {
      uVar13 = uVar25;
    }
  }
LAB_00201a80:
  lVar15 = local_10a0;
  uVar12 = (cpi->rc).worst_quality;
  uVar25 = uVar12;
  if ((int)uVar13 < (int)uVar12) {
    uVar25 = uVar13;
  }
  uVar6 = (cpi->rc).best_quality;
  if ((int)uVar13 < (int)uVar6) {
    uVar25 = uVar6;
  }
  if ((int)uVar22 < (int)uVar12) {
    uVar12 = uVar22;
  }
  if ((int)uVar22 < (int)uVar25) {
    uVar12 = uVar25;
  }
  *puVar23 = uVar12;
  *local_1080 = uVar25;
  frame_type = (cpi->common).current_frame.frame_type;
  if (((frame_type == '\0') && ((pAVar28->p_rc).this_key_frame_forced == 0)) &&
     ((cpi->common).current_frame.frame_number != 0)) {
    dVar31 = 2.0;
LAB_00201b03:
    iVar11 = av1_compute_qdelta_by_rate(cpi,frame_type,uVar12,dVar31);
  }
  else {
    iVar11 = 0;
    if (((cpi->rc).is_src_frame_alt_ref == 0) &&
       ((dVar31 = 1.75, (cpi->refresh_frame).golden_frame != false ||
        (iVar11 = 0, (cpi->refresh_frame).alt_ref_frame == true)))) goto LAB_00201b03;
  }
  uVar22 = iVar11 + uVar12;
  *puVar23 = uVar22;
  if ((int)uVar22 <= (int)*local_1080) {
    uVar22 = *local_1080;
  }
  *puVar23 = uVar22;
  if ((int)local_1090 != 3) {
    if (((cpi->common).current_frame.frame_type == '\0') &&
       ((pAVar28->p_rc).this_key_frame_forced != 0)) {
      uVar25 = (pAVar28->p_rc).last_boosted_qindex;
    }
    else {
      uVar22 = av1_rc_regulate_q(cpi,(cpi->rc).this_frame_target,uVar25,uVar12,local_10b0,local_10ac
                                );
      uVar25 = uVar22;
      if (((int)*puVar23 < (int)uVar22) &&
         (uVar25 = *puVar23, (cpi->rc).max_frame_bandwidth <= (cpi->rc).this_frame_target)) {
        *puVar23 = uVar22;
        uVar25 = uVar22;
      }
    }
  }
LAB_00201881:
  if ((pAVar28->gf_group).update_type[lVar15] == '\x03') {
    (pAVar28->p_rc).arf_q = uVar25;
  }
  return uVar25;
}

Assistant:

int av1_rc_pick_q_and_bounds(AV1_COMP *cpi, int width, int height, int gf_index,
                             int *bottom_index, int *top_index) {
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  int q;
  // TODO(sarahparker) merge no-stats vbr and altref q computation
  // with rc_pick_q_and_bounds().
  const GF_GROUP *gf_group = &cpi->ppi->gf_group;
  if ((cpi->oxcf.rc_cfg.mode != AOM_Q ||
       gf_group->update_type[gf_index] == ARF_UPDATE) &&
      has_no_stats_stage(cpi)) {
    if (cpi->oxcf.rc_cfg.mode == AOM_CBR) {
      // TODO(yunqing): the results could be used for encoder optimization.
      cpi->rec_sse = UINT64_MAX;
      if (cpi->sf.hl_sf.accurate_bit_estimate &&
          cpi->common.current_frame.frame_type != KEY_FRAME)
        rc_compute_variance_onepass_rt(cpi);

      q = rc_pick_q_and_bounds_no_stats_cbr(cpi, width, height, bottom_index,
                                            top_index);
      // preserve copy of active worst quality selected.
      cpi->rc.active_worst_quality = *top_index;

#if USE_UNRESTRICTED_Q_IN_CQ_MODE
    } else if (cpi->oxcf.rc_cfg.mode == AOM_CQ) {
      q = rc_pick_q_and_bounds_no_stats_cq(cpi, width, height, bottom_index,
                                           top_index);
#endif  // USE_UNRESTRICTED_Q_IN_CQ_MODE
    } else {
      q = rc_pick_q_and_bounds_no_stats(cpi, width, height, bottom_index,
                                        top_index);
    }
  } else {
    q = rc_pick_q_and_bounds(cpi, width, height, gf_index, bottom_index,
                             top_index);
  }
  if (gf_group->update_type[gf_index] == ARF_UPDATE) p_rc->arf_q = q;

  return q;
}